

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::update_name_cache
          (Compiler *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cache_primary,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cache_secondary,string *name)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  spirv_cross local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [55];
  undefined1 local_69;
  string local_68 [7];
  bool use_linked_underscore;
  string tmpname;
  uint local_44;
  anon_class_8_1_e30e2065 aStack_40;
  uint32_t counter;
  anon_class_8_1_e30e2065 insert_name;
  anon_class_16_2_991edefb find_name;
  string *name_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cache_secondary_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cache_primary_local;
  Compiler *this_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    aStack_40.cache_primary = cache_primary;
    insert_name.cache_primary = cache_primary;
    bVar1 = update_name_cache::anon_class_16_2_991edefb::operator()
                      ((anon_class_16_2_991edefb *)&insert_name,name);
    if (bVar1) {
      local_44 = 0;
      ::std::__cxx11::string::string(local_68,(string *)name);
      local_69 = 1;
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68,"_");
      if (bVar1) {
        ::std::__cxx11::string::operator+=(local_68,"0");
      }
      else {
        pcVar3 = (char *)::std::__cxx11::string::back();
        if (*pcVar3 == '_') {
          local_69 = 0;
        }
      }
      do {
        local_44 = local_44 + 1;
        ::std::operator+(local_c0,(char *)local_68);
        convert_to_string<unsigned_int,_0>(local_e0,&local_44);
        ::std::operator+(local_a0,local_c0);
        ::std::__cxx11::string::operator=((string *)name,(string *)local_a0);
        ::std::__cxx11::string::~string((string *)local_a0);
        ::std::__cxx11::string::~string((string *)local_e0);
        ::std::__cxx11::string::~string((string *)local_c0);
        bVar1 = update_name_cache::anon_class_16_2_991edefb::operator()
                          ((anon_class_16_2_991edefb *)&insert_name,name);
      } while (bVar1);
      update_name_cache::anon_class_8_1_e30e2065::operator()(&stack0xffffffffffffffc0,name);
      ::std::__cxx11::string::~string(local_68);
    }
    else {
      update_name_cache::anon_class_8_1_e30e2065::operator()(&stack0xffffffffffffffc0,name);
    }
  }
  return;
}

Assistant:

void Compiler::update_name_cache(unordered_set<string> &cache_primary, const unordered_set<string> &cache_secondary,
                                 string &name)
{
	if (name.empty())
		return;

	const auto find_name = [&](const string &n) -> bool {
		if (cache_primary.find(n) != end(cache_primary))
			return true;

		if (&cache_primary != &cache_secondary)
			if (cache_secondary.find(n) != end(cache_secondary))
				return true;

		return false;
	};

	const auto insert_name = [&](const string &n) { cache_primary.insert(n); };

	if (!find_name(name))
	{
		insert_name(name);
		return;
	}

	uint32_t counter = 0;
	auto tmpname = name;

	bool use_linked_underscore = true;

	if (tmpname == "_")
	{
		// We cannot just append numbers, as we will end up creating internally reserved names.
		// Make it like _0_<counter> instead.
		tmpname += "0";
	}
	else if (tmpname.back() == '_')
	{
		// The last_character is an underscore, so we don't need to link in underscore.
		// This would violate double underscore rules.
		use_linked_underscore = false;
	}

	// If there is a collision (very rare),
	// keep tacking on extra identifier until it's unique.
	do
	{
		counter++;
		name = tmpname + (use_linked_underscore ? "_" : "") + convert_to_string(counter);
	} while (find_name(name));
	insert_name(name);
}